

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::InternReadFile
          (OpenGEXImporter *this,string *filename,aiScene *pScene,IOSystem *pIOHandler)

{
  ulong __n;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Context *pCVar3;
  aiNode *this_00;
  DeadlyImportError *this_01;
  vector<char,_std::allocator<char>_> buffer;
  OpenDDLParser myParser;
  IOStream *stream;
  
  std::__cxx11::string::string((string *)&myParser,"rb",(allocator *)&buffer);
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(filename->_M_dataplus)._M_p,myParser.m_logCallback);
  stream = (IOStream *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string((string *)&myParser);
  if (stream != (IOStream *)0x0) {
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    BaseImporter::TextFileToBuffer(stream,&buffer,FORBID_EMPTY);
    (*pIOHandler->_vptr_IOSystem[5])(pIOHandler,stream);
    ODDLParser::OpenDDLParser::OpenDDLParser(&myParser);
    ODDLParser::OpenDDLParser::setBuffer
              (&myParser,
               buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    bVar1 = ODDLParser::OpenDDLParser::parse(&myParser);
    if (bVar1) {
      pCVar3 = ODDLParser::OpenDDLParser::getContext(&myParser);
      this->m_ctx = pCVar3;
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      pScene->mRootNode = this_00;
      __n = filename->_M_string_length;
      if (__n < 0x400) {
        (this_00->mName).length = (ai_uint32)__n;
        memcpy((this_00->mName).data,(filename->_M_dataplus)._M_p,__n);
        (this_00->mName).data[__n] = '\0';
      }
      handleNodes(this,this->m_ctx->m_root,pScene);
    }
    copyMeshes(this,pScene);
    copyCameras(this,pScene);
    copyLights(this,pScene);
    copyMaterials(this,pScene);
    resolveReferences(this);
    createNodeTree(this,pScene);
    ODDLParser::OpenDDLParser::~OpenDDLParser(&myParser);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buffer.super__Vector_base<char,_std::allocator<char>_>);
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&myParser,
                 "Failed to open file ",filename);
  DeadlyImportError::DeadlyImportError(this_01,(string *)&myParser);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OpenGEXImporter::InternReadFile( const std::string &filename, aiScene *pScene, IOSystem *pIOHandler ) {
    // open source file
    IOStream *file = pIOHandler->Open( filename, "rb" );
    if( !file ) {
        throw DeadlyImportError( "Failed to open file " + filename );
    }

    std::vector<char> buffer;
    TextFileToBuffer( file, buffer );
    pIOHandler->Close( file );

    OpenDDLParser myParser;
    myParser.setBuffer( &buffer[ 0 ], buffer.size() );
    bool success( myParser.parse() );
    if( success ) {
        m_ctx = myParser.getContext();
        pScene->mRootNode = new aiNode;
        pScene->mRootNode->mName.Set( filename );
        handleNodes( m_ctx->m_root, pScene );
    }

    copyMeshes( pScene );
    copyCameras( pScene );
    copyLights( pScene );
    copyMaterials( pScene );
    resolveReferences();
    createNodeTree( pScene );
}